

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

_Bool upb_Arena_IncRefFor(upb_Arena *a,void *owner)

{
  char *pcVar1;
  upb_ArenaInternal *ai;
  uintptr_t uVar2;
  uintptr_t parent_or_count;
  bool bVar3;
  upb_ArenaRoot uVar4;
  
  pcVar1 = a[1].ptr_dont_copy_me__upb_internal_use_only;
  if (((ulong)pcVar1 & 1) == 0) {
    ai = (upb_ArenaInternal *)(a + 1);
    do {
      uVar4 = _upb_Arena_FindRoot(ai);
      parent_or_count = uVar4.tagged_count;
      ai = uVar4.root;
      uVar2 = _upb_Arena_RefCountFromTagged(parent_or_count);
      LOCK();
      bVar3 = parent_or_count == ai->parent_or_count;
      if (bVar3) {
        ai->parent_or_count = uVar2 * 2 + 3;
      }
      UNLOCK();
    } while (!bVar3);
  }
  return ((ulong)pcVar1 & 1) == 0;
}

Assistant:

bool upb_Arena_IncRefFor(const upb_Arena* a, const void* owner) {
  upb_ArenaInternal* ai = upb_Arena_Internal(a);
  if (_upb_ArenaInternal_HasInitialBlock(ai)) return false;
  upb_ArenaRoot r;
  r.root = ai;

retry:
  r = _upb_Arena_FindRoot(r.root);
  if (upb_Atomic_CompareExchangeWeak(
          &r.root->parent_or_count, &r.tagged_count,
          _upb_Arena_TaggedFromRefcount(
              _upb_Arena_RefCountFromTagged(r.tagged_count) + 1),
          // Relaxed order is safe on success, incrementing the refcount
          // need not perform any synchronization with the eventual free of the
          // arena - that's provided by decrements.
          memory_order_relaxed,
          // Relaxed order is safe on failure as r.tagged_count is immediately
          // overwritten by retrying the find root operation.
          memory_order_relaxed)) {
    // We incremented it successfully, so we are done.
    return true;
  }
  // We failed update due to parent switching on the arena.
  goto retry;
}